

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O0

void __thiscall
Fl_PostScript_Graphics_Driver::page
          (Fl_PostScript_Graphics_Driver *this,double pw,double ph,int media)

{
  uint uVar1;
  uint local_54;
  uint local_44;
  uint local_28;
  int r;
  int media_local;
  double ph_local;
  double pw_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  if (this->nPages != 0) {
    fprintf((FILE *)this->output,"CR\nGR\nGR\nGR\nSP\nrestore\n");
  }
  this->nPages = this->nPages + 1;
  fprintf((FILE *)this->output,"%%%%Page: %i %i\n",(ulong)(uint)this->nPages,
          (ulong)(uint)this->nPages);
  if (pw <= ph) {
    uVar1 = (uint)pw;
    local_44 = (uint)ph;
  }
  else {
    uVar1 = (uint)ph;
    local_44 = (uint)pw;
  }
  fprintf((FILE *)this->output,"%%%%PageBoundingBox: 0 0 %d %d\n",(ulong)uVar1,(ulong)local_44);
  if (pw <= ph) {
    fprintf((FILE *)this->output,"%%%%PageOrientation: Portrait\n");
  }
  else {
    fprintf((FILE *)this->output,"%%%%PageOrientation: Landscape\n");
  }
  fprintf((FILE *)this->output,"%%%%BeginPageSetup\n");
  if (((media & 0x1000U) != 0) && (1 < this->lang_level_)) {
    local_28 = media & 0x200;
    if (local_28 != 0) {
      local_28 = 2;
    }
    fprintf((FILE *)this->output,"<< /PageSize [%i %i] /Orientation %i>> setpagedevice\n",
            (ulong)(uint)(int)(pw + 0.5),(ulong)(uint)(int)(ph + 0.5),(ulong)local_28);
  }
  fprintf((FILE *)this->output,"%%%%EndPageSetup\n");
  reset(this);
  fprintf((FILE *)this->output,"save\n");
  fprintf((FILE *)this->output,"GS\n");
  clocale_printf(this,"%g %g TR\n");
  fprintf((FILE *)this->output,"1 -1 SC\n");
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[5])(this,0,0,0);
  fprintf((FILE *)this->output,"GS\n");
  if (((media & 0x1000U) == 0) || (this->lang_level_ < 2)) {
    if (pw <= ph) {
      if ((media & 0x200U) != 0) {
        fprintf((FILE *)this->output,"180 rotate %i %i translate\n",(ulong)(uint)(int)-pw,
                (ulong)(uint)(int)-ph);
      }
    }
    else if ((media & 0x200U) == 0) {
      if (this->lang_level_ == 2) {
        local_54 = (uint)(pw - ph);
      }
      else {
        local_54 = 0;
      }
      fprintf((FILE *)this->output,"90 rotate -%i -%i translate\n",(ulong)local_54,
              (ulong)(uint)(int)ph);
    }
    else {
      fprintf((FILE *)this->output,"-90 rotate %i 0 translate\n",(ulong)(uint)(int)-pw);
    }
  }
  fprintf((FILE *)this->output,"GS\nCS\n");
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::page(double pw, double ph, int media) {
  
  if (nPages){
    fprintf(output, "CR\nGR\nGR\nGR\nSP\nrestore\n");
  }
  ++nPages;
  fprintf(output, "%%%%Page: %i %i\n" , nPages , nPages);
  fprintf(output, "%%%%PageBoundingBox: 0 0 %d %d\n", pw > ph ? (int)ph : (int)pw , pw > ph ? (int)pw : (int)ph);
  if (pw>ph){
    fprintf(output, "%%%%PageOrientation: Landscape\n");
  }else{
    fprintf(output, "%%%%PageOrientation: Portrait\n");
  }
  
  fprintf(output, "%%%%BeginPageSetup\n");
  if((media & Fl_Paged_Device::MEDIA) &&(lang_level_>1)){
    int r = media & Fl_Paged_Device::REVERSED;
    if(r) r = 2;
    fprintf(output, "<< /PageSize [%i %i] /Orientation %i>> setpagedevice\n", (int)(pw+.5), (int)(ph+.5), r);
  }
  fprintf(output, "%%%%EndPageSetup\n");
  
/*  pw_ = pw;
  ph_ = ph;*/
  reset();
  
  fprintf(output, "save\n");
  fprintf(output, "GS\n");
  clocale_printf( "%g %g TR\n", (double)0 /*lm_*/ , ph_ /* - tm_*/);
  fprintf(output, "1 -1 SC\n");
  line_style(0);
  fprintf(output, "GS\n");
  
  if (!((media & Fl_Paged_Device::MEDIA) &&(lang_level_>1))){
    if (pw > ph) {
      if(media & Fl_Paged_Device::REVERSED) {
        fprintf(output, "-90 rotate %i 0 translate\n", int(-pw));
	}
      else {
        fprintf(output, "90 rotate -%i -%i translate\n", (lang_level_ == 2 ? int(pw - ph) : 0), int(ph));
	}
      }
      else {
	if(media & Fl_Paged_Device::REVERSED)
	  fprintf(output, "180 rotate %i %i translate\n", int(-pw), int(-ph));
	}
  }
  fprintf(output, "GS\nCS\n");
}